

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemDependenceGraph.cpp
# Opt level: O2

DependenceGraph * __thiscall dg::llvmdg::SDGBuilder::getOrCreateDG(SDGBuilder *this,Function *F)

{
  SystemDependenceGraph *pSVar1;
  DependenceGraph *g;
  StringRef local_50;
  string local_40;
  
  g = SystemDependenceGraph::getDG(this->_llvmsdg,F);
  if (g == (DependenceGraph *)0x0) {
    pSVar1 = this->_llvmsdg;
    local_50 = (StringRef)llvm::Value::getName();
    llvm::StringRef::str_abi_cxx11_(&local_40,&local_50);
    g = sdg::SystemDependenceGraph::createGraph((SystemDependenceGraph *)(pSVar1 + 0x28),&local_40);
    std::__cxx11::string::_M_dispose();
    SystemDependenceGraph::addFunMapping(this->_llvmsdg,F,g);
  }
  return g;
}

Assistant:

sdg::DependenceGraph &getOrCreateDG(llvm::Function *F) {
        auto *dg = _llvmsdg->getDG(F);
        if (!dg) {
            auto &g = _llvmsdg->getSDG().createGraph(F->getName().str());
            _llvmsdg->addFunMapping(F, &g);
            return g;
        }

        return *dg;
    }